

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O3

void __thiscall enact::BasicTypename::BasicTypename(BasicTypename *this,Token *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__BasicTypename_00127888;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar3 = (name->lexeme)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar3,pcVar3 + (name->lexeme)._M_string_length);
  (this->m_where).type = name->type;
  paVar1 = &(this->m_where).lexeme.field_2;
  (this->m_where).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->lexeme)._M_dataplus._M_p;
  paVar2 = &(name->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(name->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_where).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->m_where).lexeme._M_dataplus._M_p = pcVar3;
    (this->m_where).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_where).lexeme._M_string_length = (name->lexeme)._M_string_length;
  (name->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (name->lexeme)._M_string_length = 0;
  (name->lexeme).field_2._M_local_buf[0] = '\0';
  (this->m_where).col = name->col;
  (this->m_where).line = name->line;
  return;
}

Assistant:

BasicTypename::BasicTypename(Token name) :
            m_name{name.lexeme},
            m_where{std::move(name)} {}